

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O2

void __thiscall Lib::List<Kernel::TermList>::FIFO::pushBack(FIFO *this,TermList elem)

{
  List<Kernel::TermList> *pLVar1;
  FIFO *pFVar2;
  
  pLVar1 = (List<Kernel::TermList> *)List<Kernel::TermList>::operator_new(0x10);
  (pLVar1->_head)._content = elem._content;
  pLVar1->_tail = (List<Kernel::TermList> *)0x0;
  pFVar2 = (FIFO *)&this->_last->_tail;
  if (this->_last == (List<Kernel::TermList> *)0x0) {
    pFVar2 = this;
  }
  pFVar2->_first = pLVar1;
  this->_last = pLVar1;
  return;
}

Assistant:

void pushBack(C elem)
    {
      List* newLast = new List(elem);
      if (_last) {
        _last->setTail(newLast);
      } else {
        _first = newLast;
      }
      _last = newLast;
    }